

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_mac.c
# Opt level: O2

Qiniu_Error Qiniu_Mac_Auth(void *self,Qiniu_Header **header,char *url,char *addition,size_t addlen)

{
  char *addr;
  char *pcVar1;
  Qiniu_Header *pQVar2;
  Qiniu_Error QVar3;
  uint digest_len;
  Qiniu_Mac mac;
  char *path;
  char *local_80;
  char digest [65];
  
  digest_len = 0x41;
  QVar3 = Qiniu_Mac_Parse_Url(url,(char **)0x0,(size_t *)0x0,&path,(size_t *)addlen);
  if (QVar3.code == 200) {
    if (self == (void *)0x0) {
      mac.accessKey = QINIU_ACCESS_KEY;
      mac.secretKey = QINIU_SECRET_KEY;
    }
    else {
      mac.accessKey = *self;
      mac.secretKey = *(char **)((long)self + 8);
    }
    pcVar1 = mac.accessKey;
    local_80 = path;
    Qiniu_Mac_Hmac_inner(&mac,&local_80,1,addition,addlen,digest,&digest_len);
    addr = Qiniu_Memory_Encode(digest,(ulong)digest_len);
    pcVar1 = Qiniu_String_Concat("Authorization: QBox ",pcVar1,":",addr,0);
    Qiniu_Free(addr);
    pQVar2 = (Qiniu_Header *)curl_slist_append(*header,pcVar1);
    *header = pQVar2;
    Qiniu_Free(pcVar1);
    QVar3._4_4_ = 0;
    QVar3.code = Qiniu_OK.code;
    QVar3.message = Qiniu_OK.message;
  }
  return QVar3;
}

Assistant:

static Qiniu_Error Qiniu_Mac_Auth(
	void *self, Qiniu_Header **header, const char *url, const char *addition, size_t addlen)
{
	Qiniu_Error err;
	char *auth;
	char *enc_digest;
	char digest[EVP_MAX_MD_SIZE + 1];
	unsigned int digest_len = sizeof(digest);
	Qiniu_Mac mac;

	char const *path;
	err = Qiniu_Mac_Parse_Url(url, NULL, NULL, &path, NULL);
	if (err.code != 200)
	{
		return err;
	}

	if (self)
	{
		mac = *(Qiniu_Mac *)self;
	}
	else
	{
		mac.accessKey = QINIU_ACCESS_KEY;
		mac.secretKey = QINIU_SECRET_KEY;
	}
	Qiniu_Mac_Hmac(&mac, path, addition, addlen, digest, &digest_len);
	enc_digest = Qiniu_Memory_Encode(digest, digest_len);

	auth = Qiniu_String_Concat("Authorization: QBox ", mac.accessKey, ":", enc_digest, NULL);
	Qiniu_Free(enc_digest);

	*header = curl_slist_append(*header, auth);
	Qiniu_Free(auth);

	return Qiniu_OK;
}